

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::blit(Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,
                  ssize_t sy)

{
  ulong local_88;
  uint64_t sa;
  uint64_t sb;
  uint64_t sg;
  uint64_t sr;
  uint64_t a;
  uint64_t b;
  uint64_t g;
  uint64_t r;
  ssize_t xx;
  ssize_t yy;
  ssize_t h_local;
  ssize_t w_local;
  ssize_t y_local;
  ssize_t x_local;
  Image *source_local;
  Image *this_local;
  
  yy = h;
  h_local = w;
  w_local = y;
  y_local = x;
  x_local = (ssize_t)source;
  source_local = this;
  if (w < 0) {
    h_local = get_width(source);
  }
  if (yy < 0) {
    yy = get_height((Image *)x_local);
  }
  clamp_blit_dimensions(this,(Image *)x_local,&y_local,&w_local,&h_local,&yy,&sx,&sy);
  for (xx = 0; xx < yy; xx = xx + 1) {
    for (r = 0; (long)r < h_local; r = r + 1) {
      read_pixel((Image *)x_local,sx + r,sy + xx,&g,&b,&a,&sr);
      if (sr != 0) {
        if (sr != 0xff) {
          read_pixel(this,y_local + r,w_local + xx,&sg,&sb,&sa,&local_88);
          g = (sr * (g & 0xffffffff) + (0xff - sr) * (sg & 0xffffffff)) / 0xff;
          b = (sr * (b & 0xffffffff) + (0xff - sr) * (sb & 0xffffffff)) / 0xff;
          a = (sr * (a & 0xffffffff) + (0xff - sr) * (sa & 0xffffffff)) / 0xff;
          sr = (sr * (sr & 0xffffffff) + (0xff - sr) * (local_88 & 0xffffffff)) / 0xff;
        }
        write_pixel(this,y_local + r,w_local + xx,g,b,a,sr);
      }
    }
  }
  return;
}

Assistant:

void Image::blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy) {

  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (ssize_t yy = 0; yy < h; yy++) {
    for (ssize_t xx = 0; xx < w; xx++) {
      uint64_t r, g, b, a;
      source.read_pixel(sx + xx, sy + yy, &r, &g, &b, &a);
      if (a == 0) {
        continue;
      }
      if (a != 0xFF) {
        uint64_t sr, sg, sb, sa;
        this->read_pixel(x + xx, y + yy, &sr, &sg, &sb, &sa);
        r = (a * (uint32_t)r + (0xFF - a) * (uint32_t)sr) / 0xFF;
        g = (a * (uint32_t)g + (0xFF - a) * (uint32_t)sg) / 0xFF;
        b = (a * (uint32_t)b + (0xFF - a) * (uint32_t)sb) / 0xFF;
        a = (a * (uint32_t)a + (0xFF - a) * (uint32_t)sa) / 0xFF;
      }
      this->write_pixel(x + xx, y + yy, r, g, b, a);
    }
  }
}